

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O2

int __thiscall Selector::shutdown(Selector *this,int __fd,int __how)

{
  Runnable<Selector> *this_00;
  bool bVar1;
  int in_EAX;
  int extraout_EAX;
  int iVar2;
  Event *ev;
  Thread *pTVar3;
  
  if (this->mShutdown == false) {
    this->mShutdown = true;
    ev = (Event *)operator_new(0x18,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                               ,0x4e);
    (ev->super_RefCount).mRefCount = 0;
    (ev->super_RefCount)._vptr_RefCount = (_func_int **)&PTR_onRefCountZero_001301a8;
    *(undefined8 *)&(ev->super_RefCount).field_0xc = 0x1fffffffe;
    EventDispatcher::sendEvent(&this->super_EventDispatcher,ev);
    this_00 = &this->mThread;
    pTVar3 = JHThread::Thread::GetCurrent();
    bVar1 = JHThread::Thread::operator==(&this_00->super_Thread,pTVar3);
    if (!bVar1) {
      JHThread::Thread::Stop(&this_00->super_Thread);
      iVar2 = JHThread::Thread::Join(&this_00->super_Thread);
      return iVar2;
    }
    pTVar3 = JHThread::Thread::GetCurrent();
    jh_log_print(2,"void Selector::shutdown()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                 ,0x57,"%s declining to call Join() on %s",pTVar3->mName,
                 (this->mThread).super_Thread.mName);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void Selector::shutdown()
{
	if ( not mShutdown )
	{
		mShutdown = true;
		EventDispatcher::sendEvent( jh_new Event( Event::kShutdownEventId,
												  PRIORITY_HIGH ) );

		// Selectors should not be shutdown by their own threads.
		// This is dangerous.
		if ( mThread == *Thread::GetCurrent() )
		{
			LOG_WARN( "%s declining to call Join() on %s",
					  Thread::GetCurrent()->GetName(),
					  mThread.GetName() );
		}
		else
		{
			LOG_NOISE( "%s waiting for thread %s to die",
					   Thread::GetCurrent()->GetName(),
					   mThread.GetName() );
			mThread.Stop();
			mThread.Join();
		}
	}
}